

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  long in_RSI;
  int in_EDI;
  FILE *stream;
  FILE *in_stack_000000a0;
  
  if (in_EDI != 2) {
    usage();
    exit(0);
  }
  pFVar1 = fopen(*(char **)(in_RSI + 8),"r");
  if (pFVar1 == (FILE *)0x0) {
    fprintf(_stderr,"can\'t open object file %s\n",*(undefined8 *)(in_RSI + 8));
    exit(0);
  }
  printf("Dump of object file \"%s\"\n",*(undefined8 *)(in_RSI + 8));
  dump(in_stack_000000a0);
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
	FILE* stream;

	if (argc != 2)
	{
		usage();
		exit(0);
	}

	stream = fopen(argv[1], "r");
	if (stream == NULL)
	{
		fprintf(stderr, "can't open object file %s\n", argv[1]);
		exit(0);
	}

	printf("Dump of object file \"%s\"\n", argv[1]);
	dump(stream);
	exit(1);
}